

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
::operator*=(List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
             *this,uint v)

{
  Matrix_entry *entry_00;
  Zp_field_operators<unsigned_int,_void> *this_00;
  bool bVar1;
  Element e2;
  reference ppEVar2;
  uint *e1;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range3;
  Field_element val;
  uint v_local;
  List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *this_local;
  
  e2 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value(this->operators_,v);
  if (e2 == 0) {
    clear(this);
  }
  else if (e2 != 1) {
    __end0 = std::__cxx11::
             list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
             ::begin(&this->column_);
    entry = (Entry *)std::__cxx11::
                     list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                     ::end(&this->column_);
    while (bVar1 = std::operator!=(&__end0,(_Self *)&entry), bVar1) {
      ppEVar2 = std::
                _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
                ::operator*(&__end0);
      entry_00 = *ppEVar2;
      this_00 = this->operators_;
      e1 = Entry_field_element<unsigned_int>::get_element
                     (&entry_00->super_Entry_field_element_option);
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace(this_00,e1,e2);
      Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
      ::update_entry(&this->super_Row_access_option,entry_00);
      std::
      _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
      ::operator++(&__end0);
    }
  }
  return this;
}

Assistant:

inline List_column<Master_matrix>& List_column<Master_matrix>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == 0u) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == 1u) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}